

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location_impl.hpp
# Opt level: O2

ostringstream * toml::detail::format_line(ostringstream *oss,size_t lnw,size_t linenum,string *line)

{
  char cVar1;
  long lVar2;
  pointer pcVar3;
  size_type sVar4;
  int iVar5;
  ostream *poVar6;
  int c;
  uint uVar7;
  size_type sVar8;
  string local_50;
  
  poVar6 = std::operator<<((ostream *)oss,' ');
  poVar6 = color::ansi::bold(poVar6);
  poVar6 = color::ansi::blue(poVar6);
  lVar2 = *(long *)poVar6;
  *(long *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x10) = (long)(int)lnw;
  lVar2 = *(long *)(lVar2 + -0x18);
  *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffff4f | 0x80;
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6," | ");
  color::ansi::reset(poVar6);
  pcVar3 = (line->_M_dataplus)._M_p;
  sVar4 = line->_M_string_length;
  for (sVar8 = 0; sVar4 != sVar8; sVar8 = sVar8 + 1) {
    cVar1 = pcVar3[sVar8];
    uVar7 = (uint)cVar1;
    iVar5 = isgraph(uVar7);
    if ((uVar7 == 0x20) || (iVar5 != 0)) {
      std::operator<<((ostream *)oss,cVar1);
    }
    else {
      show_char_abi_cxx11_(&local_50,(detail *)(ulong)uVar7,c);
      std::operator<<((ostream *)oss,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  std::operator<<((ostream *)oss,'\n');
  return oss;
}

Assistant:

TOML11_INLINE std::ostringstream& format_line(std::ostringstream& oss,
    const std::size_t lnw, const std::size_t linenum, const std::string& line)
{
    // 10 | key = "value"
    oss << ' ' << color::bold << color::blue
        << std::setw(static_cast<int>(lnw))
        << std::right << linenum << " | "  << color::reset;
    for(const char c : line)
    {
        if(std::isgraph(c) || c == ' ')
        {
            oss << c;
        }
        else
        {
            oss << show_char(c);
        }
    }
    oss << '\n';
    return oss;
}